

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O3

Image16Bit *
Image_Function::ConvertTo16Bit
          (Image16Bit *__return_storage_ptr__,Image *in,uint32_t startXIn,uint32_t startYIn,
          uint32_t width,uint32_t height)

{
  ImageTemplate<unsigned_short> local_58;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,width,height);
  PenguinV_Image::ImageTemplate<unsigned_short>::ImageTemplate(&local_58,0,0,'\x01','\x01');
  PenguinV_Image::ImageTemplate<unsigned_short>::generate
            (__return_storage_ptr__,&local_58,width,height,in->_colorCount,'\x01');
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00121d50;
  PenguinV_Image::ImageTemplate<unsigned_short>::clear(&local_58);
  ConvertTo16Bit(in,startXIn,startYIn,__return_storage_ptr__,0,0,width,height);
  return __return_storage_ptr__;
}

Assistant:

Image16Bit ConvertTo16Bit( const Image & in, uint32_t startXIn, uint32_t startYIn, uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, width, height );

        Image16Bit out = Image16Bit().generate( width, height, in.colorCount() );
        ConvertTo16Bit( in, startXIn, startYIn, out, 0, 0, width, height );

        return out;
    }